

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::init
          (TextureGatherCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deBool dVar5;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  RenderContext *pRVar8;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  int *piVar9;
  TestLog *pTVar10;
  TestError *pTVar11;
  char *pcVar12;
  MovePtr *pMVar13;
  ObjectWrapper *pOVar14;
  MessageBuilder *pMVar15;
  Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4> *this_02;
  TextureSwizzleComponent *pTVar16;
  TextureGatherCase *extraout_RAX;
  TypedObjectWrapper<(glu::ObjectType)2> *in_stack_fffffffffffff0f8;
  undefined8 in_stack_fffffffffffff100;
  char *local_c90;
  MessageBuilder local_c88;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  MessageBuilder local_ae0;
  MessageBuilder local_960;
  MessageBuilder local_7e0;
  MessageBuilder local_660;
  deUint32 local_4e0;
  int local_4dc;
  deUint32 curGLSwizzle;
  int i;
  deUint32 swizzleNamesGL [4];
  char *local_4b8;
  MessageBuilder local_4b0;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_329;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_328;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_318;
  TextureFormat local_308;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_> local_2f9;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  local_2f8;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *local_2e8;
  undefined1 local_2d5;
  int local_2d4;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_28d;
  int local_28c;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  LogNumber<long> local_1d0;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  LogNumber<long> local_e8;
  undefined1 local_78 [8];
  IVec2 offsetRange;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  bool supportsES32;
  long lStack_28;
  deUint32 texTypeGL;
  Functions *gl;
  RenderContext *renderCtx;
  TestLog *log;
  TextureGatherCase *this_local;
  
  log = (TestLog *)this;
  renderCtx = (RenderContext *)
              tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  gl = (Functions *)Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (**(_func_int **)((long)gl->activeShaderProgram + 0x18))();
  lStack_28 = CONCAT44(extraout_var,iVar4);
  local_38._12_4_ = getGLTextureType(this->m_textureType);
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  local_38._M_allocated_capacity._4_4_ = (*pRVar8->_vptr_RenderContext[2])();
  local_38._M_allocated_capacity._0_4_ = glu::ApiType::es(3,2);
  local_38._M_local_buf[0xb] =
       glu::contextSupports
                 ((ContextType)local_38._M_allocated_capacity._4_4_,
                  (ApiType)local_38._M_allocated_capacity._0_4_);
  bVar3 = requireGpuShader5(this->m_gatherType);
  if ((bVar3) && ((local_38._M_local_buf[0xb] & 1U) == 0)) {
    this_00 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_gpu_shader5");
    if (!bVar3) {
      offsetRange.m_data[0]._3_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"GL_EXT_gpu_shader5 required",
                 (allocator<char> *)&stack0xffffffffffffffa7);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_58);
      offsetRange.m_data[0]._3_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (this->m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    getOffsetRange((TextureGatherCase *)local_78);
    pRVar8 = renderCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"ImplementationMinTextureGatherOffset",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "Implementation\'s value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
    piVar9 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)local_78,0);
    tcu::LogNumber<long>::LogNumber
              (&local_e8,&local_108,&local_130,&local_158,QP_KEY_TAG_NONE,(long)*piVar9);
    pTVar10 = tcu::TestLog::operator<<((TestLog *)pRVar8,&local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"ImplementationMaxTextureGatherOffset",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,
               "Implementation\'s value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
    piVar9 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)local_78,1);
    tcu::LogNumber<long>::LogNumber
              (&local_1d0,&local_1f0,&local_218,&local_240,QP_KEY_TAG_NONE,(long)*piVar9);
    tcu::TestLog::operator<<(pTVar10,&local_1d0);
    tcu::LogNumber<long>::~LogNumber(&local_1d0);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    tcu::LogNumber<long>::~LogNumber(&local_e8);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) ||
         (piVar9 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)local_78,0), -8 < *piVar9)) {
        local_28d = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        local_28c = -8;
        de::toString<int>(&local_288,&local_28c);
        std::operator+(&local_268,"GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most ",&local_288
                      );
        pcVar12 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar11,pcVar12,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                   ,0x4f4);
        local_28d = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) ||
         (piVar9 = tcu::Vector<int,_2>::operator[]((Vector<int,_2> *)local_78,1), *piVar9 < 7)) {
        local_2d5 = 1;
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        local_2d4 = 7;
        de::toString<int>(&local_2d0,&local_2d4);
        std::operator+(&local_2b0,"GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least ",
                       &local_2d0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar11,pcVar12,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                   ,0x4f5);
        local_2d5 = 0;
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
  }
  pMVar13 = (MovePtr *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)pMVar13,(RenderContext *)gl);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>::DefaultDeleter(&local_2f9);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::MovePtr();
  local_2e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2f8,pMVar13);
  data._8_8_ = in_stack_fffffffffffff100;
  data.ptr = in_stack_fffffffffffff0f8;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::operator=(&this->m_colorBuffer,data);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
              *)&local_2f8);
  pcVar1 = *(code **)(lStack_28 + 0xa0);
  pOVar14 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             ::operator*(&(this->m_colorBuffer).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        )->super_ObjectWrapper;
  dVar6 = glu::ObjectWrapper::operator*(pOVar14);
  (*pcVar1)(0x8d41,dVar6);
  pcVar1 = *(code **)(lStack_28 + 0x1238);
  local_308 = this->m_colorBufferFormat;
  dVar6 = glu::getInternalFormat(local_308);
  iVar4 = tcu::Vector<int,_2>::x
                    ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
  iVar7 = tcu::Vector<int,_2>::y
                    ((Vector<int,_2> *)&(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
  (*pcVar1)(0x8d41,dVar6,iVar4,iVar7);
  dVar6 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar6,"Create and setup renderbuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x4fd);
  pMVar13 = (MovePtr *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)pMVar13,(RenderContext *)gl);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_329);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr();
  local_318 = de::details::MovePtr::operator_cast_to_PtrData(&local_328,pMVar13);
  data_00._8_8_ = in_stack_fffffffffffff100;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_fffffffffffff0f8;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::operator=(&this->m_fbo,data_00);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&local_328);
  pcVar1 = *(code **)(lStack_28 + 0x78);
  pOVar14 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_fbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar6 = glu::ObjectWrapper::operator*(pOVar14);
  (*pcVar1)(0x8d40,dVar6);
  pcVar1 = *(code **)(lStack_28 + 0x688);
  pOVar14 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             ::operator*(&(this->m_colorBuffer).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        )->super_ObjectWrapper;
  dVar6 = glu::ObjectWrapper::operator*(pOVar14);
  (*pcVar1)(0x8d40,0x8ce0,0x8d41,dVar6);
  dVar6 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar6,"Create and setup framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x502);
  tcu::TestLog::operator<<
            (&local_4b0,(TestLog *)renderCtx,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<
                      (&local_4b0,
                       (char (*) [58])"Using a framebuffer object with renderbuffer with format ");
  dVar6 = glu::getInternalFormat(this->m_colorBufferFormat);
  local_4b8 = glu::getTextureFormatName(dVar6);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_4b8);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [11])" and size ");
  pMVar15 = tcu::MessageBuilder::operator<<
                      (pMVar15,(Vector<int,_2> *)
                               &(anonymous_namespace)::TextureGatherCase::RENDER_SIZE);
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  this->m_currentIteration = 0;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  uVar2 = local_38._12_4_;
  pcVar1 = *(code **)(lStack_28 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  (*pcVar1)(uVar2,0x2802,dVar6);
  uVar2 = local_38._12_4_;
  pcVar1 = *(code **)(lStack_28 + 0x1360);
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  (*pcVar1)(uVar2,0x2803,dVar6);
  uVar2 = local_38._12_4_;
  pcVar1 = *(code **)(lStack_28 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  (*pcVar1)(uVar2,0x2801,dVar6);
  uVar2 = local_38._12_4_;
  pcVar1 = *(code **)(lStack_28 + 0x1360);
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  (*pcVar1)(uVar2,0x2800,dVar6);
  if (this->m_baseLevel != 0) {
    (**(code **)(lStack_28 + 0x1360))(local_38._12_4_,0x813c,this->m_baseLevel);
  }
  bVar3 = isDepthFormat(&this->m_textureFormat);
  if (bVar3) {
    (**(code **)(lStack_28 + 0x1360))(local_38._12_4_,0x884c,0x884e);
    uVar2 = local_38._12_4_;
    pcVar1 = *(code **)(lStack_28 + 0x1360);
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    (*pcVar1)(uVar2,0x884d,dVar6);
  }
  bVar3 = MaybeTextureSwizzle::isSome(&this->m_textureSwizzle);
  if (bVar3) {
    _curGLSwizzle = 0x8e4300008e42;
    swizzleNamesGL[0] = 0x8e44;
    swizzleNamesGL[1] = 0x8e45;
    for (local_4dc = 0; local_4dc < 4; local_4dc = local_4dc + 1) {
      this_02 = MaybeTextureSwizzle::getSwizzle(&this->m_textureSwizzle);
      pTVar16 = tcu::
                Vector<deqp::gles31::Functional::(anonymous_namespace)::TextureSwizzleComponent,_4>
                ::operator[](this_02,local_4dc);
      local_4e0 = getGLTextureSwizzleComponent(*pTVar16);
      (**(code **)(lStack_28 + 0x1360))(local_38._12_4_,(&curGLSwizzle)[local_4dc],local_4e0);
    }
  }
  dVar6 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar6,"Set texture parameters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                  ,0x52f);
  tcu::TestLog::operator<<
            (&local_ae0,(TestLog *)renderCtx,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<(&local_ae0,(char (*) [23])"Texture base level is ");
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_baseLevel);
  pTVar10 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_960,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<(&local_960,(char (*) [24])"s and t wrap modes are ");
  dVar6 = glu::getGLWrapMode(this->m_wrapS);
  local_ae8 = glu::getTextureWrapModeName(dVar6);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_ae8);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [6])0xf11459);
  dVar6 = glu::getGLWrapMode(this->m_wrapT);
  local_af0 = glu::getTextureWrapModeName(dVar6);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_af0);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [15])0xf19d72);
  pTVar10 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_7e0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<
                      (&local_7e0,(char (*) [49])"Minification and magnification filter modes are ")
  ;
  dVar6 = glu::getGLFilterMode(this->m_minFilter);
  local_af8 = glu::getTextureFilterName(dVar6);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_af8);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [6])0xf11459);
  dVar6 = glu::getGLFilterMode(this->m_magFilter);
  local_b00 = glu::getTextureFilterName(dVar6);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_b00);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [16])", respectively ");
  local_b08 = "(note that they should have no effect on gather result)";
  if ((this->m_flags & 1) != 0) {
    local_b08 = "(note that they cause the texture to be incomplete)";
  }
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_b08);
  pTVar10 = tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_660,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<(&local_660,(char (*) [23])"Using texture swizzle ");
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_textureSwizzle);
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_660);
  tcu::MessageBuilder::~MessageBuilder(&local_7e0);
  tcu::MessageBuilder::~MessageBuilder(&local_960);
  tcu::MessageBuilder::~MessageBuilder(&local_ae0);
  if (this->m_shadowCompareMode != COMPAREMODE_NONE) {
    tcu::TestLog::operator<<
              (&local_c88,(TestLog *)renderCtx,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_c88,(char (*) [28])"Using texture compare func ");
    dVar6 = glu::getGLCompareFunc(this->m_shadowCompareMode);
    local_c90 = glu::getCompareFuncName(dVar6);
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_c90);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_c88);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void TextureGatherCase::init (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
	const glw::Functions&		gl				= renderCtx.getFunctions();
	const deUint32				texTypeGL		= getGLTextureType(m_textureType);
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// Check prerequisites.
	if (requireGpuShader5(m_gatherType) && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
		throw tcu::NotSupportedError("GL_EXT_gpu_shader5 required");

	// Log and check implementation offset limits, if appropriate.
	if (m_offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2 offsetRange = getOffsetRange();
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("GL_MIN_PROGRAM_TEXTURE_GATHER_OFFSET must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("GL_MAX_PROGRAM_TEXTURE_GATHER_OFFSET must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Create rbo and fbo.

	m_colorBuffer = MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
	gl.bindRenderbuffer(GL_RENDERBUFFER, **m_colorBuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, glu::getInternalFormat(m_colorBufferFormat), RENDER_SIZE.x(), RENDER_SIZE.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup renderbuffer object");

	m_fbo = MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_colorBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Create and setup framebuffer object");

	log << TestLog::Message << "Using a framebuffer object with renderbuffer with format "
							<< glu::getTextureFormatName(glu::getInternalFormat(m_colorBufferFormat))
							<< " and size " << RENDER_SIZE << TestLog::EndMessage;

	// Generate subclass-specific iterations.

	generateIterations();
	m_currentIteration = 0;

	// Initialize texture.

	createAndUploadTexture();
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_S,		glu::getGLWrapMode(m_wrapS));
	gl.texParameteri(texTypeGL, GL_TEXTURE_WRAP_T,		glu::getGLWrapMode(m_wrapT));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MIN_FILTER,	glu::getGLFilterMode(m_minFilter));
	gl.texParameteri(texTypeGL, GL_TEXTURE_MAG_FILTER,	glu::getGLFilterMode(m_magFilter));

	if (m_baseLevel != 0)
		gl.texParameteri(texTypeGL, GL_TEXTURE_BASE_LEVEL, m_baseLevel);

	if (isDepthFormat(m_textureFormat))
	{
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		gl.texParameteri(texTypeGL, GL_TEXTURE_COMPARE_FUNC, glu::getGLCompareFunc(m_shadowCompareMode));
	}

	if (m_textureSwizzle.isSome())
	{
		const deUint32 swizzleNamesGL[4] =
		{
			GL_TEXTURE_SWIZZLE_R,
			GL_TEXTURE_SWIZZLE_G,
			GL_TEXTURE_SWIZZLE_B,
			GL_TEXTURE_SWIZZLE_A
		};

		for (int i = 0; i < 4; i++)
		{
			const deUint32 curGLSwizzle = getGLTextureSwizzleComponent(m_textureSwizzle.getSwizzle()[i]);
			gl.texParameteri(texTypeGL, swizzleNamesGL[i], curGLSwizzle);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texture parameters");

	log << TestLog::Message << "Texture base level is " << m_baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapS)) << " and "
							<< glu::getTextureWrapModeName(glu::getGLWrapMode(m_wrapT)) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_minFilter)) << " and "
							<< glu::getTextureFilterName(glu::getGLFilterMode(m_magFilter)) << ", respectively "
							<< ((m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ?
								"(note that they cause the texture to be incomplete)" :
								"(note that they should have no effect on gather result)")
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_textureSwizzle << TestLog::EndMessage;

	if (m_shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << glu::getCompareFuncName(glu::getGLCompareFunc(m_shadowCompareMode)) << TestLog::EndMessage;
}